

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsu.c
# Opt level: O2

UINT8 device_start_vsu(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  UINT32 UVar2;
  uint uVar3;
  DEV_DATA info;
  uint uVar4;
  
  info.chipInf = calloc(1,0x210);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    return 0xff;
  }
  uVar1 = cfg->clock;
  *(uint *)&((DEV_DATA *)((long)info.chipInf + 0x1f0))->chipInf = uVar1;
  uVar3 = uVar1 / 0x78;
  *(uint *)((long)info.chipInf + 500) = uVar3;
  if (cfg->srMode == '\x02') {
    uVar4 = cfg->smplRate;
    if (uVar4 <= uVar3) goto LAB_00160955;
  }
  else {
    if (cfg->srMode != '\x01') goto LAB_00160955;
    uVar4 = cfg->smplRate;
  }
  *(uint *)((long)info.chipInf + 500) = uVar4;
  uVar3 = uVar4;
LAB_00160955:
  ((DEV_DATA *)((long)info.chipInf + 0x1f8))->chipInf =
       (void *)(CONCAT44(uVar1,uVar3 >> 1) / (ulong)uVar3);
  vsu_set_mute_mask(info.chipInf,0);
  *(void **)info.chipInf = info.chipInf;
  UVar2 = *(UINT32 *)((long)info.chipInf + 500);
  retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
  retDevInf->sampleRate = UVar2;
  retDevInf->devDef = &devDef;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  return '\0';
}

Assistant:

static UINT8 device_start_vsu(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	vsu_state* chip;
	
	chip = (vsu_state*)calloc(1, sizeof(vsu_state));
	if (chip == NULL)
		return 0xFF;
	
	chip->clock = cfg->clock;
	// sample rate according to https://github.com/emu-rs/rustual-boy/blob/master/rustual-boy-core/src/vsu/mod.rs
	// 20 MHz / 480 = 41.667 Hz, VGMs use 5 MHz / 120
	chip->smplrate = chip->clock / 120;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, chip->smplrate, cfg->smplRate);
	
	RC_SET_RATIO(&chip->cycleCntr, cfg->clock, chip->smplrate);
	
	vsu_set_mute_mask(chip, 0x00);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, chip->smplrate, &devDef);
	
	return 0x00;
}